

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O0

int __thiscall iqnet::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int *piVar1;
  network_error *this_00;
  Inet_addr *pIVar2;
  undefined4 in_register_00000034;
  allocator<char> local_49;
  string local_48;
  bool local_25;
  int local_24;
  bool wouldblock;
  SystemSockAddrIn *pSStack_20;
  int code;
  sockaddr *saddr;
  Inet_addr *peer_addr_local;
  Socket *this_local;
  
  saddr = (sockaddr *)CONCAT44(in_register_00000034,__fd);
  peer_addr_local = (Inet_addr *)this;
  pSStack_20 = Inet_addr::get_sockaddr((Inet_addr *)saddr);
  local_24 = ::connect(this->sock,(sockaddr *)pSStack_20,0x10);
  local_25 = false;
  if (local_24 == -1) {
    piVar1 = __errno_location();
    local_25 = *piVar1 == 0x73;
    if (!local_25) {
      this_00 = (network_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Socket::connect",&local_49);
      network_error::network_error(this_00,&local_48,true,0);
      __cxa_throw(this_00,&network_error::typeinfo,network_error::~network_error);
    }
  }
  pIVar2 = Inet_addr::operator=(&this->peer,(Inet_addr *)saddr);
  return ((uint)CONCAT71((int7)((ulong)pIVar2 >> 8),local_25) ^ 0xff) & 0xffffff01;
}

Assistant:

bool Socket::connect( const iqnet::Inet_addr& peer_addr )
{
  const sockaddr* saddr = reinterpret_cast<const sockaddr*>(peer_addr.get_sockaddr());

  int code = ::connect(sock, saddr, sizeof(sockaddr_in));
  bool wouldblock = false;

  if( code == -1 ) {
#ifndef WIN32
    wouldblock = errno == EINPROGRESS;
#else
    wouldblock = get_last_error() == WSAEWOULDBLOCK;
#endif

    if (!wouldblock)
      throw network_error( "Socket::connect" );
  }

  peer = peer_addr;
  return !wouldblock;
}